

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getters-setters.c
# Opt level: O0

int run_test_getters_setters(void)

{
  int iVar1;
  size_t sVar2;
  long *__ptr;
  int *piVar3;
  long *__ptr_00;
  long *plVar4;
  long lVar5;
  void *__ptr_01;
  long lVar6;
  char *__s1;
  int r;
  uv_fs_t *fs;
  uv_pipe_t *pipe;
  uv_loop_t *loop;
  
  sVar2 = uv_loop_size();
  __ptr = (long *)malloc(sVar2);
  if (__ptr == (long *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x28,"loop != NULL");
    abort();
  }
  iVar1 = uv_loop_init(__ptr);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x2a,"r == 0");
    abort();
  }
  uv_loop_set_data(__ptr,&cookie1);
  if ((int *)*__ptr != &cookie1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x2d,"loop->data == &cookie1");
    abort();
  }
  piVar3 = (int *)uv_loop_get_data(__ptr);
  if (piVar3 != &cookie1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x2e,"uv_loop_get_data(loop) == &cookie1");
    abort();
  }
  sVar2 = uv_handle_size(7);
  __ptr_00 = (long *)malloc(sVar2);
  uv_pipe_init(__ptr,__ptr_00,0);
  iVar1 = uv_handle_get_type(__ptr_00);
  if (iVar1 != 7) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x32,"uv_handle_get_type((uv_handle_t*)pipe) == UV_NAMED_PIPE");
    abort();
  }
  plVar4 = (long *)uv_handle_get_loop(__ptr_00);
  if (plVar4 != __ptr) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x34,"uv_handle_get_loop((uv_handle_t*)pipe) == loop");
    abort();
  }
  *__ptr_00 = (long)&cookie2;
  piVar3 = (int *)uv_handle_get_data(__ptr_00);
  if (piVar3 != &cookie2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x36,"uv_handle_get_data((uv_handle_t*)pipe) == &cookie2");
    abort();
  }
  uv_handle_set_data(__ptr_00,&cookie1);
  piVar3 = (int *)uv_handle_get_data(__ptr_00);
  if (piVar3 != &cookie1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x38,"uv_handle_get_data((uv_handle_t*)pipe) == &cookie1");
    abort();
  }
  if ((int *)*__ptr_00 != &cookie1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x39,"pipe->data == &cookie1");
    abort();
  }
  lVar5 = uv_stream_get_write_queue_size(__ptr_00);
  if (lVar5 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x3b,"uv_stream_get_write_queue_size((uv_stream_t*)pipe) == 0");
    abort();
  }
  __ptr_00[0xc] = __ptr_00[0xc] + 1;
  lVar5 = uv_stream_get_write_queue_size(__ptr_00);
  if (lVar5 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x3d,"uv_stream_get_write_queue_size((uv_stream_t*)pipe) == 1");
    abort();
  }
  __ptr_00[0xc] = __ptr_00[0xc] + -1;
  uv_close(__ptr_00,0);
  iVar1 = uv_run(__ptr,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x42,"r == 0");
    abort();
  }
  sVar2 = uv_req_size(6);
  __ptr_01 = malloc(sVar2);
  uv_fs_stat(__ptr,__ptr_01,".",0);
  iVar1 = uv_run(__ptr,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x48,"r == 0");
    abort();
  }
  iVar1 = uv_fs_get_type(__ptr_01);
  if (iVar1 != 6) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x4a,"uv_fs_get_type(fs) == UV_FS_STAT");
    abort();
  }
  lVar5 = uv_fs_get_result(__ptr_01);
  if (lVar5 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x4b,"uv_fs_get_result(fs) == 0");
    abort();
  }
  lVar5 = uv_fs_get_ptr(__ptr_01);
  lVar6 = uv_fs_get_statbuf(__ptr_01);
  if (lVar5 != lVar6) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x4c,"uv_fs_get_ptr(fs) == uv_fs_get_statbuf(fs)");
    abort();
  }
  lVar5 = uv_fs_get_statbuf(__ptr_01);
  if ((*(ulong *)(lVar5 + 8) & 0x4000) == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x4d,"uv_fs_get_statbuf(fs)->st_mode & S_IFDIR");
    abort();
  }
  __s1 = (char *)uv_fs_get_path(__ptr_01);
  iVar1 = strcmp(__s1,".");
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x4e,"strcmp(uv_fs_get_path(fs), \".\") == 0");
    abort();
  }
  uv_fs_req_cleanup(__ptr_01);
  iVar1 = uv_loop_close(__ptr);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x52,"r == 0");
    abort();
  }
  free(__ptr_00);
  free(__ptr_01);
  free(__ptr);
  return 0;
}

Assistant:

TEST_IMPL(getters_setters) {
  uv_loop_t* loop;
  uv_pipe_t* pipe;
  uv_fs_t* fs;
  int r;

  loop = malloc(uv_loop_size());
  ASSERT(loop != NULL);
  r = uv_loop_init(loop);
  ASSERT(r == 0);

  uv_loop_set_data(loop, &cookie1);
  ASSERT(loop->data == &cookie1);
  ASSERT(uv_loop_get_data(loop) == &cookie1);

  pipe = malloc(uv_handle_size(UV_NAMED_PIPE));
  r = uv_pipe_init(loop, pipe, 0);
  ASSERT(uv_handle_get_type((uv_handle_t*)pipe) == UV_NAMED_PIPE);

  ASSERT(uv_handle_get_loop((uv_handle_t*)pipe) == loop);
  pipe->data = &cookie2;
  ASSERT(uv_handle_get_data((uv_handle_t*)pipe) == &cookie2);
  uv_handle_set_data((uv_handle_t*)pipe, &cookie1);
  ASSERT(uv_handle_get_data((uv_handle_t*)pipe) == &cookie1);
  ASSERT(pipe->data == &cookie1);

  ASSERT(uv_stream_get_write_queue_size((uv_stream_t*)pipe) == 0);
  pipe->write_queue_size++;
  ASSERT(uv_stream_get_write_queue_size((uv_stream_t*)pipe) == 1);
  pipe->write_queue_size--;
  uv_close((uv_handle_t*)pipe, NULL);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  fs = malloc(uv_req_size(UV_FS));
  uv_fs_stat(loop, fs, ".", NULL);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(uv_fs_get_type(fs) == UV_FS_STAT);
  ASSERT(uv_fs_get_result(fs) == 0);
  ASSERT(uv_fs_get_ptr(fs) == uv_fs_get_statbuf(fs));
  ASSERT(uv_fs_get_statbuf(fs)->st_mode & S_IFDIR);
  ASSERT(strcmp(uv_fs_get_path(fs), ".") == 0);
  uv_fs_req_cleanup(fs);

  r = uv_loop_close(loop);
  ASSERT(r == 0);

  free(pipe);
  free(fs);
  free(loop);
  return 0;
}